

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateEdit::QDateEdit(QDateEdit *this,QWidget *parent)

{
  long lVar1;
  QVariant *in_RSI;
  QDateTimeEdit *in_RDI;
  long in_FS_OFFSET;
  ConnectionType in_stack_00000010;
  QWidget *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  Type parserType;
  QDateTimeEdit *this_00;
  Connection in_stack_ffffffffffffffc8;
  QDate in_stack_ffffffffffffffd0;
  offset_in_QDateTimeEdit_to_subr in_stack_fffffffffffffff0;
  
  parserType = (Type)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QDate::QDate((QDate *)&stack0xffffffffffffffd0,2000,1,1);
  ::QVariant::QVariant((QVariant *)&stack0xffffffffffffffd8,(QDate *)in_stack_ffffffffffffffd0.jd);
  QDateTimeEdit::QDateTimeEdit(this_00,in_RSI,parserType,in_stack_ffffffffffffff98);
  ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
  *(undefined ***)&(in_RDI->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_00d12108;
  *(undefined ***)&(in_RDI->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QDateEdit_00d122f8;
  QObject::connect<void(QDateTimeEdit::*)(QDate),void(QDateEdit::*)(QDate)>
            ((Object *)in_stack_ffffffffffffffd0.jd,in_stack_fffffffffffffff0,
             (ContextType *)in_stack_ffffffffffffffc8.d_ptr,(offset_in_QDateEdit_to_subr *)0x0,
             in_stack_00000010);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDateEdit::QDateEdit(QWidget *parent)
    : QDateTimeEdit(QDATETIMEEDIT_DATE_INITIAL, QMetaType::QDate, parent)
{
    connect(this, &QDateEdit::dateChanged, this, &QDateEdit::userDateChanged);
}